

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-param-util.h
# Opt level: O1

void __thiscall
testing::internal::ParameterizedTestSuiteInfo<P256NistzSelectImplTest>::RegisterTests
          (ParameterizedTestSuiteInfo<P256NistzSelectImplTest> *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  char *__s;
  pointer pcVar2;
  element_type *peVar3;
  _Alloc_hider value_param;
  char cVar4;
  bool bVar5;
  int iVar6;
  int iVar7;
  long *plVar8;
  long *plVar9;
  ostream *poVar10;
  size_t sVar11;
  const_iterator cVar12;
  long *plVar13;
  char *pcVar14;
  undefined4 extraout_var;
  SetUpTearDownSuiteFuncType set_up_tc;
  SetUpTearDownSuiteFuncType tear_down_tc;
  TestFactoryBase *factory;
  undefined4 extraout_var_00;
  pointer pIVar15;
  string param_name;
  string test_suite_name;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  test_param_names;
  string test_name;
  ParamGenerator<P256NistzSelectImpl> generator;
  pointer local_1a0;
  string local_198;
  string local_178;
  undefined1 *local_158;
  long local_150;
  undefined1 local_148;
  undefined7 uStack_147;
  long local_138;
  P256NistzSelectImpl *local_130;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_128;
  char *local_f8;
  undefined8 local_f0;
  char local_e8;
  undefined7 uStack_e7;
  string local_d8;
  long *local_b8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_b0;
  CodeLocation local_a8;
  pointer local_80;
  pointer local_78;
  pointer local_70;
  ParameterizedTestSuiteInfo<P256NistzSelectImplTest> *local_68;
  ParamNameGeneratorFunc *local_60;
  CodeLocation local_58;
  
  local_158 = &local_148;
  local_150 = 0;
  local_148 = 0;
  local_f8 = &local_e8;
  local_f0 = 0;
  local_e8 = '\0';
  local_1a0 = (this->tests_).
              super__Vector_base<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<P256NistzSelectImplTest>::TestInfo>,_std::allocator<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<P256NistzSelectImplTest>::TestInfo>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
  local_80 = (this->tests_).
             super__Vector_base<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<P256NistzSelectImplTest>::TestInfo>,_std::allocator<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<P256NistzSelectImplTest>::TestInfo>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  if (local_1a0 != local_80) {
    bVar5 = false;
    local_68 = this;
    do {
      pIVar15 = (this->instantiations_).
                super__Vector_base<testing::internal::ParameterizedTestSuiteInfo<P256NistzSelectImplTest>::InstantiationInfo,_std::allocator<testing::internal::ParameterizedTestSuiteInfo<P256NistzSelectImplTest>::InstantiationInfo>_>
                ._M_impl.super__Vector_impl_data._M_start;
      local_78 = (this->instantiations_).
                 super__Vector_base<testing::internal::ParameterizedTestSuiteInfo<P256NistzSelectImplTest>::InstantiationInfo,_std::allocator<testing::internal::ParameterizedTestSuiteInfo<P256NistzSelectImplTest>::InstantiationInfo>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
      if (pIVar15 != local_78) {
        do {
          (*pIVar15->generator)(&local_b8);
          local_60 = pIVar15->name_func;
          __s = pIVar15->file;
          iVar7 = pIVar15->line;
          if ((pIVar15->name)._M_string_length == 0) {
            local_150 = 0;
            *local_158 = 0;
          }
          else {
            local_128._M_impl._0_8_ = &local_128._M_impl.super__Rb_tree_header._M_header._M_parent;
            pcVar2 = (pIVar15->name)._M_dataplus._M_p;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_128,pcVar2,pcVar2 + (pIVar15->name)._M_string_length);
            std::__cxx11::string::append((char *)&local_128);
            std::__cxx11::string::operator=((string *)&local_158,(string *)&local_128);
            if ((_Base_ptr *)local_128._M_impl._0_8_ !=
                &local_128._M_impl.super__Rb_tree_header._M_header._M_parent) {
              operator_delete((void *)local_128._M_impl._0_8_,
                              (ulong)((long)&(local_128._M_impl.super__Rb_tree_header._M_header.
                                             _M_parent)->_M_color + 1));
            }
          }
          std::__cxx11::string::_M_append
                    ((char *)&local_158,(ulong)(this->test_suite_name_)._M_dataplus._M_p);
          local_128._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
          local_128._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
          local_128._M_impl.super__Rb_tree_header._M_header._M_left =
               &local_128._M_impl.super__Rb_tree_header._M_header;
          local_128._M_impl.super__Rb_tree_header._M_node_count = 0;
          local_128._M_impl.super__Rb_tree_header._M_header._M_right =
               local_128._M_impl.super__Rb_tree_header._M_header._M_left;
          plVar8 = (long *)(**(code **)(*local_b8 + 0x10))();
          plVar9 = (long *)(**(code **)(*local_b8 + 0x18))();
          local_70 = pIVar15;
          if (plVar8 != plVar9) {
            local_138 = 0;
            do {
              cVar4 = (**(code **)(*plVar8 + 0x30))(plVar8,plVar9);
              if (cVar4 != '\0') break;
              local_130 = (P256NistzSelectImpl *)(**(code **)(*plVar8 + 0x28))();
              local_f0 = 0;
              *local_f8 = '\0';
              local_198.field_2._M_allocated_capacity = (size_type)local_130->select_w7;
              local_198._M_dataplus._M_p = local_130->name;
              local_198._M_string_length = (size_type)local_130->select_w5;
              local_198.field_2._8_8_ = local_138;
              (*local_60)(&local_178,(TestParamInfo<P256NistzSelectImpl> *)&local_198);
              bVar5 = IsValidParamName(&local_178);
              bVar5 = IsTrue(bVar5);
              if (!bVar5) {
                GTestLog::GTestLog((GTestLog *)&local_198,GTEST_FATAL,
                                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/third_party/googletest/googletest/include/gtest/internal/gtest-param-util.h"
                                   ,0x247);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cerr,"Condition IsValidParamName(param_name) failed. ",
                           0x2f);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cerr,"Parameterized test name \'",0x19);
                poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                                    ((ostream *)&std::cerr,local_178._M_dataplus._M_p,
                                     local_178._M_string_length);
                std::__ostream_insert<char,std::char_traits<char>>
                          (poVar10,
                           "\' is invalid (contains spaces, dashes, or any non-alphanumeric characters other than underscores), in "
                           ,0x66);
                if (__s == (char *)0x0) {
                  std::ios::clear((int)poVar10 + (int)*(undefined8 *)(*(long *)poVar10 + -0x18));
                }
                else {
                  sVar11 = strlen(__s);
                  std::__ostream_insert<char,std::char_traits<char>>(poVar10,__s,sVar11);
                }
                std::__ostream_insert<char,std::char_traits<char>>(poVar10," line ",6);
                poVar10 = (ostream *)std::ostream::operator<<(poVar10,iVar7);
                std::__ostream_insert<char,std::char_traits<char>>(poVar10,"",0);
                std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + (char)poVar10);
                std::ostream::put((char)poVar10);
                std::ostream::flush();
                GTestLog::~GTestLog((GTestLog *)&local_198);
              }
              cVar12 = std::
                       _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ::find(&local_128,&local_178);
              bVar5 = IsTrue((_Rb_tree_header *)cVar12._M_node ==
                             &local_128._M_impl.super__Rb_tree_header);
              if (!bVar5) {
                GTestLog::GTestLog((GTestLog *)&local_198,GTEST_FATAL,
                                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/third_party/googletest/googletest/include/gtest/internal/gtest-param-util.h"
                                   ,0x24d);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cerr,
                           "Condition test_param_names.count(param_name) == 0 failed. ",0x3a);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cerr,"Duplicate parameterized test name \'",0x23);
                poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                                    ((ostream *)&std::cerr,local_178._M_dataplus._M_p,
                                     local_178._M_string_length);
                std::__ostream_insert<char,std::char_traits<char>>(poVar10,"\', in ",6);
                if (__s == (char *)0x0) {
                  std::ios::clear((int)poVar10 + (int)*(undefined8 *)(*(long *)poVar10 + -0x18));
                }
                else {
                  sVar11 = strlen(__s);
                  std::__ostream_insert<char,std::char_traits<char>>(poVar10,__s,sVar11);
                }
                std::__ostream_insert<char,std::char_traits<char>>(poVar10," line ",6);
                plVar13 = (long *)std::ostream::operator<<(poVar10,iVar7);
                std::ios::widen((char)*(undefined8 *)(*plVar13 + -0x18) + (char)plVar13);
                std::ostream::put((char)plVar13);
                std::ostream::flush();
                GTestLog::~GTestLog((GTestLog *)&local_198);
              }
              peVar3 = (local_1a0->
                       super___shared_ptr<testing::internal::ParameterizedTestSuiteInfo<P256NistzSelectImplTest>::TestInfo,_(__gnu_cxx::_Lock_policy)2>
                       )._M_ptr;
              if ((peVar3->test_base_name)._M_string_length != 0) {
                pcVar14 = (char *)std::__cxx11::string::_M_append
                                            ((char *)&local_f8,
                                             (ulong)(peVar3->test_base_name)._M_dataplus._M_p);
                std::__cxx11::string::append(pcVar14);
              }
              std::__cxx11::string::_M_append((char *)&local_f8,(ulong)local_178._M_dataplus._M_p);
              std::
              _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
              ::_M_insert_unique<std::__cxx11::string>
                        ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                          *)&local_128,&local_178);
              local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_d8,local_158,local_158 + local_150);
              pcVar14 = local_f8;
              PrintToString<P256NistzSelectImpl>(&local_198,local_130);
              value_param._M_p = local_198._M_dataplus._M_p;
              peVar3 = (local_1a0->
                       super___shared_ptr<testing::internal::ParameterizedTestSuiteInfo<P256NistzSelectImplTest>::TestInfo,_(__gnu_cxx::_Lock_policy)2>
                       )._M_ptr;
              local_a8.file._M_dataplus._M_p = (pointer)&local_a8.file.field_2;
              pcVar2 = (peVar3->code_location).file._M_dataplus._M_p;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_a8,pcVar2,
                         pcVar2 + (peVar3->code_location).file._M_string_length);
              local_a8.line = (peVar3->code_location).line;
              iVar6 = (*(this->super_ParameterizedTestSuiteInfoBase).
                        _vptr_ParameterizedTestSuiteInfoBase[3])(this);
              set_up_tc = SuiteApiResolver<P256NistzSelectImplTest>::GetSetUpCaseOrSuite(__s,iVar7);
              tear_down_tc = SuiteApiResolver<P256NistzSelectImplTest>::GetTearDownCaseOrSuite
                                       (__s,iVar7);
              factory = (TestFactoryBase *)
                        (**(code **)(*(long *)(((local_1a0->
                                                super___shared_ptr<testing::internal::ParameterizedTestSuiteInfo<P256NistzSelectImplTest>::TestInfo,_(__gnu_cxx::_Lock_policy)2>
                                                )._M_ptr)->test_meta_factory)._M_t.
                                              super___uniq_ptr_impl<testing::internal::TestMetaFactoryBase<P256NistzSelectImpl>,_std::default_delete<testing::internal::TestMetaFactoryBase<P256NistzSelectImpl>_>_>
                                              ._M_t.
                                              super__Tuple_impl<0UL,_testing::internal::TestMetaFactoryBase<P256NistzSelectImpl>_*,_std::default_delete<testing::internal::TestMetaFactoryBase<P256NistzSelectImpl>_>_>
                                              .
                                              super__Head_base<0UL,_testing::internal::TestMetaFactoryBase<P256NistzSelectImpl>_*,_false>
                                    + 0x10))();
              MakeAndRegisterTestInfo
                        (&local_d8,pcVar14,(char *)0x0,value_param._M_p,&local_a8,
                         (TypeId)CONCAT44(extraout_var,iVar6),set_up_tc,tear_down_tc,factory);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_a8.file._M_dataplus._M_p != &local_a8.file.field_2) {
                operator_delete(local_a8.file._M_dataplus._M_p,
                                local_a8.file.field_2._M_allocated_capacity + 1);
              }
              this = local_68;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_198._M_dataplus._M_p != &local_198.field_2) {
                operator_delete(local_198._M_dataplus._M_p,
                                (ulong)(local_198.field_2._M_allocated_capacity + 1));
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
                operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1
                               );
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_178._M_dataplus._M_p != &local_178.field_2) {
                operator_delete(local_178._M_dataplus._M_p,
                                local_178.field_2._M_allocated_capacity + 1);
              }
              (**(code **)(*plVar8 + 0x18))(plVar8);
              local_138 = local_138 + 1;
              bVar5 = true;
            } while (plVar8 != plVar9);
          }
          if (plVar9 != (long *)0x0) {
            (**(code **)(*plVar9 + 8))(plVar9);
          }
          pIVar15 = local_70;
          if (plVar8 != (long *)0x0) {
            (**(code **)(*plVar8 + 8))();
          }
          std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~_Rb_tree(&local_128);
          if (local_b0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_b0);
          }
          pIVar15 = pIVar15 + 1;
        } while (pIVar15 != local_78);
      }
      local_1a0 = local_1a0 + 1;
    } while (local_1a0 != local_80);
    if (bVar5) goto LAB_002fe76b;
  }
  iVar7 = (*(this->super_ParameterizedTestSuiteInfoBase)._vptr_ParameterizedTestSuiteInfoBase[2])
                    (this);
  paVar1 = &local_58.file.field_2;
  pcVar2 = (this->code_location_).file._M_dataplus._M_p;
  local_58.file._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_58,pcVar2,pcVar2 + (this->code_location_).file._M_string_length);
  local_58.line = (this->code_location_).line;
  InsertSyntheticTestCase
            ((string *)CONCAT44(extraout_var_00,iVar7),&local_58,
             (this->tests_).
             super__Vector_base<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<P256NistzSelectImplTest>::TestInfo>,_std::allocator<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<P256NistzSelectImplTest>::TestInfo>_>_>
             ._M_impl.super__Vector_impl_data._M_start !=
             (this->tests_).
             super__Vector_base<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<P256NistzSelectImplTest>::TestInfo>,_std::allocator<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<P256NistzSelectImplTest>::TestInfo>_>_>
             ._M_impl.super__Vector_impl_data._M_finish);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58.file._M_dataplus._M_p != paVar1) {
    operator_delete(local_58.file._M_dataplus._M_p,local_58.file.field_2._M_allocated_capacity + 1);
  }
LAB_002fe76b:
  if (local_f8 != &local_e8) {
    operator_delete(local_f8,CONCAT71(uStack_e7,local_e8) + 1);
  }
  if (local_158 != &local_148) {
    operator_delete(local_158,CONCAT71(uStack_147,local_148) + 1);
  }
  return;
}

Assistant:

void RegisterTests() override {
    bool generated_instantiations = false;

    std::string test_suite_name;
    std::string test_name;
    for (const std::shared_ptr<TestInfo>& test_info : tests_) {
      for (const InstantiationInfo& instantiation : instantiations_) {
        const std::string& instantiation_name = instantiation.name;
        ParamGenerator<ParamType> generator((*instantiation.generator)());
        ParamNameGeneratorFunc* name_func = instantiation.name_func;
        const char* file = instantiation.file;
        int line = instantiation.line;

        if (!instantiation_name.empty())
          test_suite_name = instantiation_name + "/";
        else
          test_suite_name.clear();
        test_suite_name += test_suite_name_;

        size_t i = 0;
        std::set<std::string> test_param_names;
        for (const auto& param : generator) {
          generated_instantiations = true;

          test_name.clear();

          std::string param_name =
              name_func(TestParamInfo<ParamType>(param, i));

          GTEST_CHECK_(IsValidParamName(param_name))
              << "Parameterized test name '" << param_name
              << "' is invalid (contains spaces, dashes, or any "
                 "non-alphanumeric characters other than underscores), in "
              << file << " line " << line << "" << std::endl;

          GTEST_CHECK_(test_param_names.count(param_name) == 0)
              << "Duplicate parameterized test name '" << param_name << "', in "
              << file << " line " << line << std::endl;

          if (!test_info->test_base_name.empty()) {
            test_name.append(test_info->test_base_name).append("/");
          }
          test_name += param_name;

          test_param_names.insert(std::move(param_name));

          MakeAndRegisterTestInfo(
              test_suite_name, test_name.c_str(),
              nullptr,  // No type parameter.
              PrintToString(param).c_str(), test_info->code_location,
              GetTestSuiteTypeId(),
              SuiteApiResolver<TestSuite>::GetSetUpCaseOrSuite(file, line),
              SuiteApiResolver<TestSuite>::GetTearDownCaseOrSuite(file, line),
              test_info->test_meta_factory->CreateTestFactory(param));
          ++i;
        }  // for param
      }  // for instantiation
    }  // for test_info

    if (!generated_instantiations) {
      // There are no generaotrs, or they all generate nothing ...
      InsertSyntheticTestCase(GetTestSuiteName(), code_location_,
                              !tests_.empty());
    }
  }